

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O3

BoxList * __thiscall amrex::BoxList::enclosedCells(BoxList *this,int dir)

{
  int *piVar1;
  pointer pBVar2;
  byte bVar3;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  Box *bx;
  pointer pBVar4;
  
  pBVar4 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar2 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar4 != pBVar2) {
    bVar3 = (byte)dir & 0x1f;
    do {
      if (((pBVar4->btype).itype & 1 << ((byte)dir & 0x1f)) != 0) {
        piVar1 = (pBVar4->bigend).vect + dir;
        *piVar1 = *piVar1 + -1;
        (pBVar4->btype).itype = (pBVar4->btype).itype & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
      }
      pBVar4 = pBVar4 + 1;
    } while (pBVar4 != pBVar2);
  }
  return this;
}

Assistant:

BoxList&
BoxList::enclosedCells (int dir) noexcept
{
    for (auto& bx : m_lbox)
    {
        bx.enclosedCells(dir);
    }
    return *this;
}